

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * match(MatchState *ms,char *s,char *p)

{
  int iVar1;
  char *pcVar2;
  char *ep_00;
  bool bVar3;
  char *local_70;
  uint local_58;
  char *res;
  int m;
  char *ep_1;
  char previous;
  char *ep;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  iVar1 = ms->depth + 1;
  ms->depth = iVar1;
  ep = p;
  p_local = s;
  if (200 < iVar1) {
    lj_err_caller(ms->L,LJ_ERR_STRPATX);
  }
LAB_0019447c:
  pcVar2 = p_local;
  switch(*ep) {
  case '\0':
    goto LAB_001947f7;
  default:
    break;
  case '$':
    if (ep[1] == '\0') {
      if (p_local != ms->src_end) {
        p_local = (char *)0x0;
        pcVar2 = p_local;
      }
      goto LAB_001947f7;
    }
    break;
  case '%':
    if (ep[1] == 'b') {
      p_local = matchbalance(ms,p_local,ep + 2);
      pcVar2 = p_local;
      if (p_local == (char *)0x0) goto LAB_001947f7;
      ep = ep + 4;
    }
    else {
      if (ep[1] == 'f') goto LAB_00194569;
      if ((""[(ulong)(byte)ep[1] + 1] & 8) == 0) break;
      p_local = match_capture(ms,p_local,(uint)(byte)ep[1]);
      pcVar2 = p_local;
      if (p_local == (char *)0x0) goto LAB_001947f7;
      ep = ep + 2;
    }
    goto LAB_0019447c;
  case '(':
    if (ep[1] == ')') {
      pcVar2 = start_capture(ms,p_local,ep + 2,-2);
    }
    else {
      pcVar2 = start_capture(ms,p_local,ep + 1,-1);
    }
    goto LAB_001947f7;
  case ')':
    pcVar2 = end_capture(ms,p_local,ep + 1);
    goto LAB_001947f7;
  }
  ep_00 = classend(ms,ep);
  bVar3 = false;
  if (p_local < ms->src_end) {
    iVar1 = singlematch((uint)(byte)*p_local,ep,ep_00);
    bVar3 = iVar1 != 0;
  }
  switch(*ep_00) {
  case '*':
    pcVar2 = max_expand(ms,p_local,ep,ep_00);
    goto LAB_001947f7;
  case '+':
    if (bVar3) {
      local_70 = max_expand(ms,p_local + 1,ep,ep_00);
    }
    else {
      local_70 = (char *)0x0;
    }
    p_local = local_70;
    pcVar2 = p_local;
    goto LAB_001947f7;
  default:
    if (!bVar3) {
      p_local = (char *)0x0;
      pcVar2 = p_local;
      goto LAB_001947f7;
    }
    p_local = p_local + 1;
    ep = ep_00;
    break;
  case '-':
    pcVar2 = min_expand(ms,p_local,ep,ep_00);
    goto LAB_001947f7;
  case '?':
    if ((bVar3) && (pcVar2 = match(ms,p_local + 1,ep_00 + 1), pcVar2 != (char *)0x0))
    goto LAB_001947f7;
    ep = ep_00 + 1;
  }
  goto LAB_0019447c;
LAB_00194569:
  pcVar2 = ep + 2;
  if (*pcVar2 != '[') {
    lj_err_caller(ms->L,LJ_ERR_STRPATB);
  }
  ep = classend(ms,pcVar2);
  if (p_local == ms->src_init) {
    local_58 = 0;
  }
  else {
    local_58 = (uint)p_local[-1];
  }
  iVar1 = matchbracketclass(local_58 & 0xff,pcVar2,ep + -1);
  if ((iVar1 != 0) || (iVar1 = matchbracketclass((uint)(byte)*p_local,pcVar2,ep + -1), iVar1 == 0))
  {
    p_local = (char *)0x0;
    pcVar2 = p_local;
LAB_001947f7:
    p_local = pcVar2;
    ms->depth = ms->depth + -1;
    return p_local;
  }
  goto LAB_0019447c;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p)
{
  if (++ms->depth > LJ_MAX_XLEVEL)
    lj_err_caller(ms->L, LJ_ERR_STRPATX);
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
  case '(':  /* start capture */
    if (*(p+1) == ')')  /* position capture? */
      s = start_capture(ms, s, p+2, CAP_POSITION);
    else
      s = start_capture(ms, s, p+1, CAP_UNFINISHED);
    break;
  case ')':  /* end capture */
    s = end_capture(ms, s, p+1);
    break;
  case L_ESC:
    switch (*(p+1)) {
    case 'b':  /* balanced string? */
      s = matchbalance(ms, s, p+2);
      if (s == NULL) break;
      p+=4;
      goto init;  /* else s = match(ms, s, p+4); */
    case 'f': {  /* frontier? */
      const char *ep; char previous;
      p += 2;
      if (*p != '[')
	lj_err_caller(ms->L, LJ_ERR_STRPATB);
      ep = classend(ms, p);  /* points to what is next */
      previous = (s == ms->src_init) ? '\0' : *(s-1);
      if (matchbracketclass(uchar(previous), p, ep-1) ||
	 !matchbracketclass(uchar(*s), p, ep-1)) { s = NULL; break; }
      p=ep;
      goto init;  /* else s = match(ms, s, ep); */
      }
    default:
      if (lj_char_isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
	s = match_capture(ms, s, uchar(*(p+1)));
	if (s == NULL) break;
	p+=2;
	goto init;  /* else s = match(ms, s, p+2) */
      }
      goto dflt;  /* case default */
    }
    break;
  case '\0':  /* end of pattern */
    break;  /* match succeeded */
  case '$':
    /* is the `$' the last char in pattern? */
    if (*(p+1) != '\0') goto dflt;
    if (s != ms->src_end) s = NULL;  /* check end of string */
    break;
  default: dflt: {  /* it is a pattern item */
    const char *ep = classend(ms, p);  /* points to what is next */
    int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
    switch (*ep) {
    case '?': {  /* optional */
      const char *res;
      if (m && ((res=match(ms, s+1, ep+1)) != NULL)) {
	s = res;
	break;
      }
      p=ep+1;
      goto init;  /* else s = match(ms, s, ep+1); */
      }
    case '*':  /* 0 or more repetitions */
      s = max_expand(ms, s, p, ep);
      break;
    case '+':  /* 1 or more repetitions */
      s = (m ? max_expand(ms, s+1, p, ep) : NULL);
      break;
    case '-':  /* 0 or more repetitions (minimum) */
      s = min_expand(ms, s, p, ep);
      break;
    default:
      if (m) { s++; p=ep; goto init; }  /* else s = match(ms, s+1, ep); */
      s = NULL;
      break;
    }
    break;
    }
  }
  ms->depth--;
  return s;
}